

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O3

void rgb_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  bool bVar5;
  ulong uVar6;
  JSAMPROW pJVar7;
  
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            *pJVar7 = pJVar2[uVar6];
            pJVar7[1] = pJVar3[uVar6];
            pJVar7[2] = pJVar4[uVar6];
            pJVar7 = pJVar7 + 3;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            pJVar7[uVar6 * 4] = pJVar2[uVar6];
            pJVar7[uVar6 * 4 + 1] = pJVar3[uVar6];
            pJVar7[uVar6 * 4 + 2] = pJVar4[uVar6];
            pJVar7[uVar6 * 4 + 3] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  case JCS_EXT_BGR:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf + 2;
          uVar6 = 0;
          do {
            *pJVar7 = pJVar2[uVar6];
            pJVar7[-1] = pJVar3[uVar6];
            pJVar7[-2] = pJVar4[uVar6];
            uVar6 = uVar6 + 1;
            pJVar7 = pJVar7 + 3;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            pJVar7[uVar6 * 4 + 2] = pJVar2[uVar6];
            pJVar7[uVar6 * 4 + 1] = pJVar3[uVar6];
            pJVar7[uVar6 * 4] = pJVar4[uVar6];
            pJVar7[uVar6 * 4 + 3] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            pJVar7[uVar6 * 4 + 3] = pJVar2[uVar6];
            pJVar7[uVar6 * 4 + 2] = pJVar3[uVar6];
            pJVar7[uVar6 * 4 + 1] = pJVar4[uVar6];
            pJVar7[uVar6 * 4] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            pJVar7[uVar6 * 4 + 1] = pJVar2[uVar6];
            pJVar7[uVar6 * 4 + 2] = pJVar3[uVar6];
            pJVar7[uVar6 * 4 + 3] = pJVar4[uVar6];
            pJVar7[uVar6 * 4] = 0xff;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
    break;
  default:
    if (0 < num_rows) {
      uVar1 = cinfo->output_width;
      do {
        if ((ulong)uVar1 != 0) {
          pJVar2 = (*input_buf)[input_row];
          pJVar3 = input_buf[1][input_row];
          pJVar4 = input_buf[2][input_row];
          pJVar7 = *output_buf;
          uVar6 = 0;
          do {
            *pJVar7 = pJVar2[uVar6];
            pJVar7[1] = pJVar3[uVar6];
            pJVar7[2] = pJVar4[uVar6];
            pJVar7 = pJVar7 + 3;
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        input_row = input_row + 1;
        output_buf = output_buf + 1;
        bVar5 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar5);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_rgb_convert(j_compress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPIMAGE output_buf, JDIMENSION output_row, int num_rows)
{
  switch (cinfo->in_color_space) {
  case JCS_EXT_RGB:
    extrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    extrgbx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    extbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    extbgrx_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    extxbgr_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    extxrgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                                 num_rows);
    break;
  default:
    rgb_rgb_convert_internal(cinfo, input_buf, output_buf, output_row,
                             num_rows);
    break;
  }
}